

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bt_peer_connection.cpp
# Opt level: O0

void __thiscall
libtorrent::bt_peer_connection::write_have(bt_peer_connection *this,piece_index_t index)

{
  int args;
  bt_peer_connection *this_local;
  piece_index_t index_local;
  
  if (((byte)(this->super_peer_connection).field_0x765 >> 3 & 1) != 0) {
    this_local._4_4_ = index.m_val;
    args = libtorrent::aux::strong_typedef::operator_cast_to_int
                     ((strong_typedef *)((long)&this_local + 4));
    send_message<int>(this,msg_have,num_outgoing_have,args);
  }
  return;
}

Assistant:

void bt_peer_connection::write_have(piece_index_t const index)
	{
		INVARIANT_CHECK;
		TORRENT_ASSERT(associated_torrent().lock()->valid_metadata());
		TORRENT_ASSERT(index >= piece_index_t(0));
		TORRENT_ASSERT(index < associated_torrent().lock()->torrent_file().end_piece());

		// if we haven't sent the bitfield yet, this piece should be included in
		// there instead
		if (!m_sent_bitfield) return;

		send_message(msg_have, counters::num_outgoing_have
			, static_cast<int>(index));
	}